

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

uint __thiscall
srell::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::lookup_backref_number
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *this,char_type *begin,char_type *end)

{
  char cVar1;
  uint uVar2;
  reference pcVar3;
  size_type local_40;
  size_t i;
  gname_string key;
  char_type *end_local;
  char_type *begin_local;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_local;
  
  key.capacity_ = (size_type)end;
  regex_internal::simple_array<char>::simple_array((simple_array<char> *)&i,(long)end - (long)begin)
  ;
  local_40 = 0;
  for (end_local = begin; end_local != (char_type *)key.capacity_; end_local = end_local + 1) {
    cVar1 = *end_local;
    pcVar3 = regex_internal::simple_array<char>::operator[]((simple_array<char> *)&i,local_40);
    *pcVar3 = cVar1;
    local_40 = local_40 + 1;
  }
  uVar2 = regex_internal::groupname_and_backrefnumber_mapper<char,_unsigned_int>::operator[]
                    (&(this->gnames_).super_groupname_and_backrefnumber_mapper<char,_unsigned_int>,
                     (gname_string *)&i);
  regex_internal::simple_array<char>::~simple_array((simple_array<char> *)&i);
  return uVar2;
}

Assistant:

unsigned int lookup_backref_number(const char_type *begin, const char_type *const end) const
	{
		typename regex_internal::groupname_mapper<char_type>::gname_string key(end - begin);

		for (std::size_t i = 0; begin != end; ++begin, ++i)
			key[i] = *begin;

		return gnames_[key];
	}